

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

invocation_table<afsm::test::events::do_work> *
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::ortho_sm_def::off,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>
::state_table<afsm::test::events::do_work,0ul,1ul>(indexes_tuple<0UL,_1UL> *param_1)

{
  int iVar1;
  process_event_handler<1UL> local_12;
  process_event_handler<0UL> local_11;
  indexes_tuple<0UL,_1UL> *local_10;
  indexes_tuple<0UL,_1UL> *param_1_local;
  
  if (state_table<afsm::test::events::do_work,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)::
      _table == '\0') {
    local_10 = param_1;
    iVar1 = __cxa_guard_acquire(&state_table<afsm::test::events::do_work,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                                 ::_table);
    if (iVar1 != 0) {
      std::
      function<afsm::actions::event_process_result(std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::ortho_sm_def::off,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&,afsm::test::events::do_work&&)>
      ::function<afsm::actions::detail::process_event_handler<0ul>,void>
                ((function<afsm::actions::event_process_result(std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::ortho_sm_def::off,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&,afsm::test::events::do_work&&)>
                  *)&inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
                     ::state_table<afsm::test::events::do_work,_0UL,_1UL>::_table,&local_11);
      std::
      function<afsm::actions::event_process_result(std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::ortho_sm_def::off,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&,afsm::test::events::do_work&&)>
      ::function<afsm::actions::detail::process_event_handler<1ul>,void>
                ((function<afsm::actions::event_process_result(std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::ortho_sm_def::off,afsm::state_machine<afsm::test::ortho_sm_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>&,afsm::test::events::do_work&&)>
                  *)(inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
                     ::state_table<afsm::test::events::do_work,_0UL,_1UL>::_table._M_elems + 1),
                 &local_12);
      __cxa_atexit(std::
                   array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_&,_afsm::test::events::do_work_&&)>,_2UL>
                   ::~array,&inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
                             ::state_table<afsm::test::events::do_work,_0UL,_1UL>::_table,
                   &__dso_handle);
      __cxa_guard_release(&state_table<afsm::test::events::do_work,0ul,1ul>(psst::meta::indexes_tuple<0ul,1ul>const&)
                           ::_table);
    }
  }
  return &inner_dispatch_table<std::tuple<afsm::inner_state_machine<afsm::test::ortho_sm_def::on,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>,_afsm::state<afsm::test::ortho_sm_def::off,_afsm::state_machine<afsm::test::ortho_sm_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>
          ::state_table<afsm::test::events::do_work,_0UL,_1UL>::_table;
}

Assistant:

static invocation_table<Event> const&
    state_table( ::psst::meta::indexes_tuple< Indexes... > const& )
    {
        static invocation_table<Event> _table {{ process_event_handler<Indexes>{}... }};
        return _table;
    }